

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCompleteStep(ARKodeMem ark_mem,sunrealtype dsm)

{
  int iVar1;
  ARKodeMem in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  sunrealtype troundoff;
  int retval;
  double in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ARKodeMem_conflict ark_mem_00;
  int local_4;
  
  ark_mem_00 = (ARKodeMem_conflict)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_RDI->use_compensated_sums == 0) {
    in_RDI->tcur = in_RDI->tn + in_RDI->h;
  }
  else {
    sunCompensatedSum(in_RDI->tn,in_RDI->h,&in_RDI->tcur,&in_RDI->terr);
  }
  if ((in_RDI->tstopset != 0) &&
     (in_stack_ffffffffffffffd8 = in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h)),
     ABS(in_RDI->tcur - in_RDI->tstop) <= in_stack_ffffffffffffffd8)) {
    in_RDI->tcur = in_RDI->tstop;
  }
  if (in_RDI->ProcessStep != (ARKPostProcessFn)0x0) {
    iVar1 = (*in_RDI->ProcessStep)(in_RDI->tcur,in_RDI->ycur,in_RDI->ps_data);
    if (iVar1 != 0) {
      return -0x25;
    }
    in_stack_ffffffffffffffe4 = 0;
  }
  if ((in_RDI->interp == (ARKInterp)0x0) ||
     (local_4 = arkInterpUpdate(ark_mem_00,
                                (ARKInterp)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8), local_4 == 0)) {
    N_VScale(0,in_RDI->ycur,in_RDI->yn);
    in_RDI->fn_is_current = 0;
    iVar1 = SUNAdaptController_UpdateH
                      (SUB84(in_RDI->h,0),ark_mem_00,in_RDI->hadapt_mem->hcontroller);
    if (iVar1 == 0) {
      in_RDI->nst = in_RDI->nst + 1;
      in_RDI->hold = in_RDI->h;
      in_RDI->tn = in_RDI->tcur;
      in_RDI->hprime = in_RDI->h * in_RDI->eta;
      in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->growth;
      in_RDI->initsetup = 0;
      in_RDI->firststage = 0;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x2f,0x9f6,"arkCompleteStep",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"Failure updating controller object");
      local_4 = -0x2f;
    }
  }
  return local_4;
}

Assistant:

int arkCompleteStep(ARKodeMem ark_mem, sunrealtype dsm)
{
  int retval;
  sunrealtype troundoff;

  /* Set current time to the end of the step (in case the last
     stage time does not coincide with the step solution time).
     If tstop is enabled, it is possible for tn + h to be past
     tstop by roundoff, and in that case, we reset tn (after
     incrementing by h) to tstop. */

  /* During long-time integration, roundoff can creep into tcur.
     Compensated summation fixes this but with increased cost, so it is optional. */
  if (ark_mem->use_compensated_sums)
  {
    sunCompensatedSum(ark_mem->tn, ark_mem->h, &ark_mem->tcur, &ark_mem->terr);
  }
  else { ark_mem->tcur = ark_mem->tn + ark_mem->h; }

  if (ark_mem->tstopset)
  {
    troundoff = FUZZ_FACTOR * ark_mem->uround *
                (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
    if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
    {
      ark_mem->tcur = ark_mem->tstop;
    }
  }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG, "ARKODE::arkCompleteStep",
                     "end-step", "step = %li, h = %" RSYM ", tcur = %" RSYM,
                     ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

  /* apply user-supplied step postprocessing function (if supplied) */
  if (ark_mem->ProcessStep != NULL)
  {
    retval = ark_mem->ProcessStep(ark_mem->tcur, ark_mem->ycur, ark_mem->ps_data);
    if (retval != 0) { return (ARK_POSTPROCESS_STEP_FAIL); }
  }

  /* update interpolation structure

     NOTE: This must be called before updating yn with ycur as the interpolation
     module may need to save tn, yn from the start of this step */
  if (ark_mem->interp != NULL)
  {
    retval = arkInterpUpdate(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* update yn to current solution */
  N_VScale(ONE, ark_mem->ycur, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Notify time step controller object of successful step */
  retval = SUNAdaptController_UpdateH(ark_mem->hadapt_mem->hcontroller,
                                      ark_mem->h, dsm);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                    "Failure updating controller object");
    return (ARK_CONTROLLER_ERR);
  }

  /* update scalar quantities */
  ark_mem->nst++;
  ark_mem->hold   = ark_mem->h;
  ark_mem->tn     = ark_mem->tcur;
  ark_mem->hprime = ark_mem->h * ark_mem->eta;

  /* Reset growth factor for subsequent time step */
  ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;

  /* Turn off flag indicating initial step and first stage */
  ark_mem->initsetup  = SUNFALSE;
  ark_mem->firststage = SUNFALSE;

  return (ARK_SUCCESS);
}